

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

bool __thiscall CCheckQueue<MemoryCheck>::Loop(CCheckQueue<MemoryCheck> *this,bool fMaster)

{
  CCheckQueue<MemoryCheck> *pCVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  MemoryCheck *check;
  byte *pbVar6;
  undefined7 in_register_00000031;
  uint uVar7;
  ulong uVar8;
  CCheckQueue<MemoryCheck> CVar9;
  CCheckQueue<MemoryCheck> *pCVar10;
  long in_FS_OFFSET;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  byte *local_68;
  byte *pbStack_60;
  undefined8 local_58;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar10 = this + 0x28;
  if ((int)CONCAT71(in_register_00000031,fMaster) != 0) {
    pCVar10 = this + 0x58;
  }
  local_68 = (byte *)0x0;
  pbStack_60 = (byte *)0x0;
  local_58 = 0;
  std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::reserve
            ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&local_68,
             (ulong)*(uint *)(this + 0xb0));
  uVar8 = 0;
  CVar9 = (CCheckQueue<MemoryCheck>)0x1;
  pbVar4 = pbStack_60;
  do {
    pbStack_60 = pbVar4;
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_48);
    if ((int)uVar8 == 0) {
      *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + 1;
    }
    else {
      this[0xa8] = (CCheckQueue<MemoryCheck>)((byte)this[0xa8] & (byte)CVar9);
      pCVar1 = this + 0xac;
      *(int *)pCVar1 = *(int *)pCVar1 - (int)uVar8;
      if (*(int *)pCVar1 == 0 && !fMaster) {
        std::condition_variable::notify_one();
      }
    }
    while( true ) {
      lVar2 = *(long *)(this + 0x90);
      if ((*(long *)(this + 0x88) != lVar2) || (this[0xd0] != (CCheckQueue<MemoryCheck>)0x0)) break;
      if ((fMaster) && (*(int *)(this + 0xac) == 0)) {
        *(int *)(this + 0xa4) = *(int *)(this + 0xa4) + -1;
        CVar9 = this[0xa8];
        this[0xa8] = (CCheckQueue<MemoryCheck>)0x1;
        goto LAB_0031bcc1;
      }
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + 1;
      std::condition_variable::wait((unique_lock *)pCVar10);
      *(int *)(this + 0xa0) = *(int *)(this + 0xa0) + -1;
    }
    if (this[0xd0] != (CCheckQueue<MemoryCheck>)0x0) {
      CVar9 = (CCheckQueue<MemoryCheck>)0x0;
LAB_0031bcc1:
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::~vector
                ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (bool)CVar9;
    }
    uVar5 = (uint)((int)lVar2 - (int)*(long *)(this + 0x88)) /
            (*(int *)(this + 0xa4) + *(int *)(this + 0xa0) + 1U);
    uVar7 = *(uint *)(this + 0xb0);
    if (uVar5 < *(uint *)(this + 0xb0)) {
      uVar7 = uVar5;
    }
    uVar8 = (ulong)(uVar7 + (uVar7 == 0));
    std::vector<MemoryCheck,std::allocator<MemoryCheck>>::
    _M_assign_aux<std::move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck*,std::vector<MemoryCheck,std::allocator<MemoryCheck>>>>>
              ((vector<MemoryCheck,std::allocator<MemoryCheck>> *)&local_68,
               (MemoryCheck *)(lVar2 - uVar8),lVar2);
    std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::_M_erase
              ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)(this + 0x88),
               (MemoryCheck *)(lVar2 - uVar8),*(MemoryCheck **)(this + 0x90));
    CVar9 = this[0xa8];
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    pbVar6 = local_68;
    pbVar4 = pbStack_60;
    if (local_68 != pbStack_60) {
      do {
        if (((byte)CVar9 & 1) != 0) {
          CVar9 = (CCheckQueue<MemoryCheck>)0x1;
        }
        pbVar6 = pbVar6 + 1;
        pbVar3 = local_68;
      } while (pbVar6 != pbStack_60);
      for (; pbVar3 != pbStack_60; pbVar3 = pbVar3 + 1) {
        LOCK();
        MemoryCheck::fake_allocated_memory.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)MemoryCheck::fake_allocated_memory.super___atomic_base<unsigned_long>._M_i -
             (ulong)*pbVar3);
        UNLOCK();
        pbVar4 = local_68;
      }
    }
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }